

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O2

void __thiscall
kj::_::LogExpectation::logMessage
          (LogExpectation *this,LogSeverity severity,char *file,int line,int contextDepth,
          String *text)

{
  size_t sVar1;
  bool bVar2;
  char *pcVar3;
  StringPtr haystack;
  
  if ((this->seen == false) && (this->severity == severity)) {
    sVar1 = (text->content).size_;
    if (sVar1 == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (text->content).ptr;
    }
    haystack.content.size_ = sVar1 + (sVar1 == 0);
    haystack.content.ptr = pcVar3;
    bVar2 = hasSubstring(haystack,(StringPtr)(this->substring).content);
    if (bVar2) {
      this->seen = true;
      return;
    }
  }
  ExceptionCallback::logMessage(&this->super_ExceptionCallback,severity,file,line,contextDepth,text)
  ;
  return;
}

Assistant:

void LogExpectation::logMessage(
    LogSeverity severity, const char* file, int line, int contextDepth,
    String&& text) {
  if (!seen && severity == this->severity) {
    if (hasSubstring(text, substring)) {
      // Match. Ignore it.
      seen = true;
      return;
    }
  }

  // Pass up the chain.
  ExceptionCallback::logMessage(severity, file, line, contextDepth, kj::mv(text));
}